

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPluginLib.h
# Opt level: O1

shared_ptr<NumberGeneratorImpl> __thiscall
plugin::StdPluginLib::AddExtension<NumberGeneratorImpl>(StdPluginLib *this)

{
  NumberGeneratorImpl *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<NumberGeneratorImpl> sVar2;
  shared_ptr<plugin::interfaces::IPluginInterface> local_30;
  
  this_00 = (NumberGeneratorImpl *)operator_new(8);
  NumberGeneratorImpl::NumberGeneratorImpl(this_00);
  (this->super_IPluginLib)._vptr_IPluginLib = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<NumberGeneratorImpl*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_extensions,this_00);
  local_30.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(this->super_IPluginLib)._vptr_IPluginLib;
  local_30.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->m_extensions).
       super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (local_30.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(local_30.
                 super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count)->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    &(local_30.
                      super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
      UNLOCK();
    }
    else {
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(local_30.
                 super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count)->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    &(local_30.
                      super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count)->_M_pi + 1;
    }
  }
  std::
  vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>>>
  ::emplace_back<std::shared_ptr<plugin::interfaces::IPluginInterface>>
            ((vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>>>
              *)(in_RSI + 8),&local_30);
  _Var1._M_pi = extraout_RDX;
  if (local_30.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<NumberGeneratorImpl>)
         sVar2.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IFACEIMPL> AddExtension()
        {
            // Using operator new instead of std::make_shared because
            // interface instances have private constructors, and a friend
            // relationship to allow this function to construct them.
            std::shared_ptr<IFACEIMPL> const instance { new IFACEIMPL };
            m_extensions.push_back(instance);
            return instance;
       }